

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O2

void __thiscall liblogger::LogFile::LogFile(LogFile *this,string *fname)

{
  FILE *pFVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  LogException *this_00;
  string sStack_1c8;
  stringstream ss;
  ostream local_198 [376];
  
  (this->super_ILogger)._vptr_ILogger = (_func_int **)&PTR__LogFile_00152078;
  std::__cxx11::string::string((string *)&this->m_fname,(string *)fname);
  pFVar1 = fopen((this->m_fname)._M_dataplus._M_p,"a");
  this->m_fp = (FILE *)pFVar1;
  if (pFVar1 != (FILE *)0x0) {
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar2 = std::operator<<(local_198,"Cannot open file: \'");
  poVar2 = std::operator<<(poVar2,(string *)&this->m_fname);
  poVar2 = std::operator<<(poVar2,"\' error: ");
  piVar3 = __errno_location();
  pcVar4 = strerror(*piVar3);
  std::operator<<(poVar2,pcVar4);
  this_00 = (LogException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  LogException::LogException(this_00,&sStack_1c8);
  __cxa_throw(this_00,&LogException::typeinfo,LogException::~LogException);
}

Assistant:

LogFile::LogFile(const std::string &fname) :
	m_fname(fname)
{
	m_fp = fopen(m_fname.c_str(), "a");
	if (m_fp == NULL)
	{
		std::stringstream ss;
		ss << "Cannot open file: '" << m_fname << "' error: " << strerror(errno);
		throw(LogException(ss.str()));
	}
}